

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int get_http_header_len(char *buf,int buflen)

{
  byte bVar1;
  uint uVar2;
  ushort **ppuVar3;
  ulong uVar4;
  
  uVar2 = buflen;
  if (buflen < 1) {
    uVar2 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar2 == uVar4) {
      return 0;
    }
    bVar1 = buf[uVar4];
    if (-1 < (char)bVar1) {
      if (((bVar1 != 10) && (bVar1 != 0xd)) &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x40) == 0)
         ) {
        return -1;
      }
      if (bVar1 == 10 && (long)uVar4 < (long)(buflen + -1)) {
        if (buf[uVar4 + 1] == '\n') {
          return (int)uVar4 + 2;
        }
      }
      else if (((bVar1 == 0xd && (long)uVar4 < (long)(buflen + -3)) && (buf[uVar4 + 1] == '\n')) &&
              ((buf[uVar4 + 2] == '\r' && (buf[uVar4 + 3] == '\n')))) {
        return (int)uVar4 + 4;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int
get_http_header_len(const char *buf, int buflen)
{
	int i;
	for (i = 0; i < buflen; i++) {
		/* Do an unsigned comparison in some conditions below */
		const unsigned char c = (unsigned char)buf[i];

		if ((c < 128) && ((char)c != '\r') && ((char)c != '\n')
		    && !isprint(c)) {
			/* abort scan as soon as one malformed character is found */
			return -1;
		}

		if (i < buflen - 1) {
			if ((buf[i] == '\n') && (buf[i + 1] == '\n')) {
				/* Two newline, no carriage return - not standard compliant,
				 * but it should be accepted */
				return i + 2;
			}
		}

		if (i < buflen - 3) {
			if ((buf[i] == '\r') && (buf[i + 1] == '\n') && (buf[i + 2] == '\r')
			    && (buf[i + 3] == '\n')) {
				/* Two \r\n - standard compliant */
				return i + 4;
			}
		}
	}

	return 0;
}